

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_AssertionTest_x_iutest_x_ScopedTrace_Test::Body
          (iu_AssertionTest_x_iutest_x_ScopedTrace_Test *this)

{
  iuStreamMessage *piVar1;
  int x;
  ScopedMessage scoped_message_0;
  ScopedMessage scoped_message_1;
  int local_384;
  iuCodeMessage local_380;
  iuCodeMessage local_350;
  iuStreamMessage local_320;
  iuStreamMessage local_198;
  
  local_384 = 100;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_320.m_stream);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  piVar1 = iutest::detail::iuStreamMessage::operator<<(&local_198,(char (*) [3])"x=");
  piVar1 = iutest::detail::iuStreamMessage::operator<<(piVar1,&local_384);
  iutest::detail::iuStreamMessage::operator<<(&local_320,piVar1);
  std::__cxx11::stringbuf::str();
  local_350.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
  ;
  local_350.m_line = 0x118;
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)&local_380,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_320.m_stream);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)&local_380);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_320.m_stream);
  iutest::detail::iuStreamMessage::operator<<(&local_320,(char (*) [5])0x30e3d1);
  std::__cxx11::stringbuf::str();
  local_380.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
  ;
  local_380.m_line = 0x11b;
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)&local_198,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_320.m_stream);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)&local_198);
  return;
}

Assistant:

IUTEST(AssertionTest, ScopedTrace)
{
    {
        int x=100;
        IUTEST_SCOPED_TRACE(::iutest::Message() << "x=" << x);
    }
    {
        IUTEST_SCOPED_TRACE("test");
    }
}